

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleTypeDefinitions(ExpressionTranslateContext *ctx)

{
  TypeBase **ppTVar1;
  uint i;
  uint index;
  
  PrintIndentedLine(ctx,"// Type definitions");
  PrintIndentedLine(ctx,"#pragma pack(push, 4)");
  for (index = 0; index < (ctx->ctx->types).count; index = index + 1) {
    ppTVar1 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,index);
    TranslateTypeDefinition(ctx,*ppTVar1);
  }
  PrintIndentedLine(ctx,"#pragma pack(pop)");
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleTypeDefinitions(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type definitions");
	PrintIndentedLine(ctx, "#pragma pack(push, 4)");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		TranslateTypeDefinition(ctx, type);
	}
	PrintIndentedLine(ctx, "#pragma pack(pop)");

	PrintLine(ctx);
}